

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O2

xmlOutputBufferCreateFilenameFunc
xmlThrDefOutputBufferCreateFilenameDefault(xmlOutputBufferCreateFilenameFunc func)

{
  xmlOutputBufferCreateFilenameFunc p_Var1;
  
  xmlMutexLock(&xmlThrDefMutex);
  p_Var1 = xmlOutputBufferCreateFilenameValueThrDef;
  if (xmlOutputBufferCreateFilenameValueThrDef == (xmlOutputBufferCreateFilenameFunc)0x0) {
    p_Var1 = __xmlOutputBufferCreateFilename;
  }
  xmlOutputBufferCreateFilenameValueThrDef = func;
  xmlMutexUnlock(&xmlThrDefMutex);
  return p_Var1;
}

Assistant:

xmlOutputBufferCreateFilenameFunc
xmlThrDefOutputBufferCreateFilenameDefault(xmlOutputBufferCreateFilenameFunc func)
{
    xmlOutputBufferCreateFilenameFunc old;

    xmlMutexLock(&xmlThrDefMutex);
    old = xmlOutputBufferCreateFilenameValueThrDef;
#ifdef LIBXML_OUTPUT_ENABLED
    if (old == NULL) {
		old = __xmlOutputBufferCreateFilename;
	}
#endif
    xmlOutputBufferCreateFilenameValueThrDef = func;
    xmlMutexUnlock(&xmlThrDefMutex);

    return(old);
}